

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-profiler_unittest.cc
# Opt level: O0

void Allocate(int start,int end,int size)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  int *piVar3;
  int local_18;
  int i;
  int size_local;
  int end_local;
  int start_local;
  
  marker = "Allocate";
  for (local_18 = start; local_18 < end; local_18 = local_18 + 1) {
    if (local_18 < 100000) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (long)size;
      uVar2 = SUB168(auVar1 * ZEXT816(4),0);
      if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
        uVar2 = 0xffffffffffffffff;
      }
      piVar3 = (int *)operator_new__(uVar2);
      g_array[local_18] = piVar3;
    }
  }
  return;
}

Assistant:

static ATTRIBUTE_NOINLINE void Allocate(int start, int end, int size) {
  // NOTE: we're using this to prevent gcc 5 from merging otherwise
  // identical Allocate & Allocate2 functions.
  marker = "Allocate";
  for (int i = start; i < end; ++i) {
    if (i < kMaxCount)
      g_array[i] = new int[size];
  }
}